

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O0

void __thiscall dap::json::JsonCppSerializer::JsonCppSerializer(JsonCppSerializer *this)

{
  Value *this_00;
  JsonCppSerializer *this_local;
  
  Serializer::Serializer(&this->super_Serializer);
  (this->super_Serializer)._vptr_Serializer = (_func_int **)&PTR__JsonCppSerializer_016965f8;
  this_00 = (Value *)operator_new(0x28);
  Json::Value::Value(this_00,nullValue);
  this->json = this_00;
  this->ownsJson = true;
  this->removed = false;
  return;
}

Assistant:

JsonCppSerializer::JsonCppSerializer()
    : json(new Json::Value()), ownsJson(true) {}